

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O2

MPP_RET hal_vp8e_enc_strm_code(void *hal,HalEncTask *task)

{
  Vp8ePutBitBuf *bitbuf;
  RK_U8 *data;
  undefined8 uVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  undefined1 uVar9;
  RK_U32 i;
  int iVar10;
  MPP_RET MVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  size_t sVar14;
  RK_U8 *pRVar15;
  void *pvVar16;
  long lVar17;
  undefined8 *puVar18;
  RK_U32 *buf;
  uint *puVar19;
  long lVar20;
  ulong uVar21;
  RK_U32 *pRVar22;
  HalVp8eCtx *ctx;
  uint uVar23;
  undefined1 *puVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  char *pcVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  undefined8 *puVar36;
  undefined8 *puVar37;
  char *pcVar38;
  int iVar39;
  HalEncTask *enc_task;
  int iVar40;
  bool bVar41;
  undefined4 uVar42;
  undefined4 uVar44;
  undefined1 auVar43 [16];
  int local_a8;
  uint auStack_88 [4];
  RK_S32 mode_update [4];
  VepuOffsetCfg local_64;
  
  lVar17 = *(long *)((long)hal + 0x70);
  for (lVar20 = 0x1a3a; lVar20 != 0x1a43; lVar20 = lVar20 + 1) {
    *(undefined8 *)((long)hal + lVar20 * 8 + -0x6930) = 0;
    *(undefined4 *)((long)hal + lVar20 * 4) = 0;
  }
  local_64.fmt = *(MppFrameFormat *)(lVar17 + 0x24);
  local_64._4_8_ = *(undefined8 *)(lVar17 + 0xc);
  local_64._12_8_ = *(undefined8 *)(lVar17 + 0x14);
  local_64.offset_x = mpp_frame_get_offset_x(task->frame);
  local_64.offset_y = mpp_frame_get_offset_y(task->frame);
  get_vepu_offset_cfg(&local_64);
  iVar10 = mpp_buffer_get_fd_with_caller(task->input,"hal_vp8e_enc_strm_code");
  *(int *)((long)hal + 0x1d4) = iVar10;
  *(int *)((long)hal + 0x1dc) = iVar10;
  *(int *)((long)hal + 0x1e4) = iVar10;
  *(RK_U32 *)((long)hal + 0x1d8) = local_64.offset_byte[0];
  *(RK_U32 *)((long)hal + 0x1e0) = local_64.offset_byte[1];
  *(RK_U32 *)((long)hal + 0x1e8) = local_64.offset_byte[2];
  lVar17 = *(long *)((long)hal + 0x60);
  sVar14 = mpp_buffer_get_size_with_caller(*(MppBuffer *)(lVar17 + 0x58),"hal_vp8e_enc_strm_code");
  iVar10 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar17 + 0x58),"hal_vp8e_enc_strm_code");
  pRVar15 = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                               (*(MppBuffer *)(lVar17 + 0x58),"hal_vp8e_enc_strm_code");
  lVar20 = 3;
  if (*(int *)((long)hal + 0x6924) == 0) {
    lVar20 = 10;
  }
  data = pRVar15 + lVar20;
  iVar39 = (int)lVar20;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x37f8),pRVar15,iVar39);
  *(int *)((long)hal + 0x194) = iVar10;
  *(int *)((long)hal + 0x198) = iVar39;
  pRVar15 = (RK_U8 *)((ulong)(data + (sVar14 & 0xffffffff) / 10) & 0xfffffffffffffff8);
  bitbuf = (Vp8ePutBitBuf *)((long)hal + 0x3820);
  iVar40 = ((uint)(data + (sVar14 & 0xffffffff) / 10) & 0xfffffff8) - (int)data;
  vp8e_set_buffer(bitbuf,data,iVar40);
  iVar40 = iVar40 + iVar39;
  *(int *)((long)hal + 0x394) = iVar10;
  *(int *)((long)hal + 0x3b4) = iVar40;
  pvVar16 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar17 + 0x58),"hal_vp8e_enc_strm_code");
  local_a8 = (int)sVar14;
  iVar39 = ((int)pvVar16 + local_a8 & 0xfffffff8U) - (int)pRVar15;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x3848),pRVar15,iVar39);
  *(int *)((long)hal + 0x398) = iVar10;
  *(int *)((long)hal + 0x3b8) = iVar40 + iVar39;
  *(int *)((long)hal + 0x19c) = iVar39;
  puVar2 = *(undefined8 **)((long)hal + 0x37e8);
  *(undefined1 *)((long)puVar2 + 0x26) = 1;
  *(undefined4 *)(puVar2 + 4) = *(undefined4 *)((long)hal + 0x6918);
  bVar41 = *(int *)((long)hal + 0x6924) == 0;
  *(bool *)((long)puVar2 + 0x24) = bVar41;
  if (bVar41) {
    *(undefined1 *)((long)puVar2 + 0x25) = 0;
    *(undefined2 *)((long)puVar2 + 0x27) = 0x101;
    *(undefined1 *)((long)puVar2 + 0x29) = 1;
    puVar18 = (undefined8 *)((long)hal + 0x3660);
    lVar17 = 4;
    while (bVar41 = lVar17 != 0, lVar17 = lVar17 + -1, bVar41) {
      if (puVar18 != puVar2) {
        puVar18[4] = 0xffffffff;
        *(undefined4 *)((long)puVar18 + 0x27) = 0;
      }
      puVar18 = puVar18 + 7;
    }
  }
  puVar18 = (undefined8 *)((long)hal + 0x3740);
  for (lVar17 = 0x3764; lVar17 != 0x380c; lVar17 = lVar17 + 0x38) {
    *(undefined8 *)((long)hal + lVar17 + -4) = 0xffffffff;
    *(undefined4 *)((long)hal + lVar17 + 3) = 0;
  }
  uVar23 = *(uint *)((long)hal + 0x3640);
  uVar21 = 0xffffffffffffffff;
  uVar32 = 0xffffffff;
  if (-1 < (int)uVar23) {
    uVar32 = uVar23;
  }
  lVar20 = (long)hal + 0x3660;
  lVar29 = (long)(int)uVar32;
  lVar17 = lVar29 + 2;
  puVar36 = (undefined8 *)((long)hal + 0x3628);
  do {
    puVar37 = puVar36;
    lVar17 = lVar17 + -1;
    if (lVar17 == 0) {
      uVar32 = 0;
      goto LAB_0025a4a5;
    }
    puVar36 = puVar37 + 7;
  } while ((puVar37 + 7 == puVar2) || (*(char *)((long)puVar37 + 0x5f) == '\0'));
  uVar32 = 1;
  *(undefined8 *)((long)hal + 0x3770) = puVar37[0xd];
  uVar1 = *puVar36;
  uVar4 = puVar37[8];
  uVar5 = puVar37[9];
  uVar6 = puVar37[10];
  uVar7 = puVar37[0xc];
  *(undefined8 *)((long)hal + 0x3760) = puVar37[0xb];
  *(undefined8 *)((long)hal + 0x3768) = uVar7;
  *(undefined8 *)((long)hal + 0x3750) = uVar5;
  *(undefined8 *)((long)hal + 0x3758) = uVar6;
  *puVar18 = uVar1;
  *(undefined8 *)((long)hal + 0x3748) = uVar4;
LAB_0025a4a5:
  lVar17 = lVar29 + 2;
  puVar36 = (undefined8 *)((long)hal + 0x3628);
  do {
    puVar37 = puVar36;
    lVar17 = lVar17 + -1;
    if (lVar17 == 0) goto LAB_0025a504;
    puVar36 = puVar37 + 7;
  } while ((puVar37 + 7 == puVar2) || (*(char *)((long)puVar37 + 0x61) == '\0'));
  uVar34 = (ulong)uVar32;
  uVar32 = uVar32 + 1;
  lVar17 = uVar34 * 0x38;
  *(undefined8 *)((long)hal + lVar17 + 0x3770) = puVar37[0xd];
  uVar1 = *puVar36;
  uVar4 = puVar37[8];
  uVar5 = puVar37[9];
  uVar6 = puVar37[10];
  uVar7 = puVar37[0xc];
  puVar36 = (undefined8 *)((long)hal + lVar17 + 0x3760);
  *puVar36 = puVar37[0xb];
  puVar36[1] = uVar7;
  puVar36 = (undefined8 *)((long)hal + lVar17 + 0x3750);
  *puVar36 = uVar5;
  puVar36[1] = uVar6;
  puVar18[uVar34 * 7] = uVar1;
  (puVar18 + uVar34 * 7)[1] = uVar4;
LAB_0025a504:
  lVar29 = lVar29 + 2;
  puVar36 = (undefined8 *)((long)hal + 0x3628);
  do {
    puVar37 = puVar36;
    lVar29 = lVar29 + -1;
    if (lVar29 == 0) goto LAB_0025a55d;
    puVar36 = puVar37 + 7;
  } while ((puVar37 + 7 == puVar2) || (*(char *)(puVar37 + 0xc) == '\0'));
  lVar17 = (ulong)uVar32 * 0x38;
  *(undefined8 *)((long)hal + lVar17 + 0x3770) = puVar37[0xd];
  uVar1 = *puVar36;
  uVar4 = puVar37[8];
  uVar5 = puVar37[9];
  uVar6 = puVar37[10];
  uVar7 = puVar37[0xc];
  puVar2 = (undefined8 *)((long)hal + lVar17 + 0x3760);
  *puVar2 = puVar37[0xb];
  puVar2[1] = uVar7;
  puVar2 = (undefined8 *)((long)hal + lVar17 + 0x3750);
  *puVar2 = uVar5;
  puVar2[1] = uVar6;
  puVar18[(ulong)uVar32 * 7] = uVar1;
  (puVar18 + (ulong)uVar32 * 7)[1] = uVar4;
LAB_0025a55d:
  uVar26 = 0;
  uVar34 = (ulong)uVar23;
  if ((int)uVar23 < 1) {
    uVar34 = uVar26;
  }
  for (; uVar34 * 0x38 - uVar26 != 0; uVar26 = uVar26 + 0x38) {
    *(undefined2 *)((long)hal + uVar26 + 0x3767) = 0;
    *(undefined1 *)((long)hal + uVar26 + 0x3769) = 0;
  }
  if (*(int *)((long)hal + 0x6924) == 1) {
    lVar17 = *(long *)((long)hal + 0x37e8);
    *(undefined1 *)(lVar17 + 0x25) = 1;
    *(undefined1 *)(lVar17 + 0x29) = 1;
    *(undefined2 *)(lVar17 + 0x27) = 0x101;
    *(undefined1 *)((long)hal + 0x376a) = 1;
    *(undefined1 *)((long)hal + 0x37a2) = 1;
    *(undefined1 *)((long)hal + 0x37da) = 1;
  }
  lVar17 = *(long *)((long)hal + 0x158);
  if (*(char *)(lVar17 + 2) == '\0') {
    return MPP_OK;
  }
  if ((*(int *)(lVar17 + 0x5c) != 0) &&
     (lVar29 = *(long *)((long)hal + 0x37e8), *(undefined1 *)(lVar29 + 0x29) = 1,
     *(char *)(lVar29 + 0x28) == '\0')) {
    *(undefined1 *)((long)hal + 0x37a0) = 1;
  }
  lVar29 = *(long *)((long)hal + 0x128);
  for (lVar30 = -4; lVar30 != 0; lVar30 = lVar30 + 1) {
    *(undefined4 *)(lVar29 + 0x2c + lVar30 * 4) = *(undefined4 *)(lVar17 + 0x18);
    *(undefined4 *)(lVar29 + 0x3c + lVar30 * 4) = *(undefined4 *)((long)hal + 0xa8);
  }
  uVar23 = *(uint *)((long)hal + 0x3640);
  lVar17 = (long)(int)uVar23;
  if (lVar17 < 2) {
    lVar29 = *(long *)((long)hal + 0x37e8);
    *(undefined1 *)(lVar29 + 0x29) = 0;
LAB_0025a673:
    *(undefined1 *)(lVar29 + 0x28) = 0;
    bVar8 = 1;
  }
  else {
    if (uVar23 == 2) {
      lVar29 = *(long *)((long)hal + 0x37e8);
      goto LAB_0025a673;
    }
    bVar8 = 0;
  }
  lVar29 = 0;
  uVar34 = 0;
  if (0 < (int)uVar23) {
    uVar34 = (ulong)uVar23;
  }
  for (; uVar34 * 0x38 - lVar29 != 0; lVar29 = lVar29 + 0x38) {
    lVar30 = *(long *)((long)hal + 0x37e8);
    if (((int)uVar23 < 2) || (*(char *)(lVar30 + 0x29) != '\0')) {
      *(undefined1 *)((long)hal + lVar29 + 0x3769) = 0;
    }
    if (!(bool)(~bVar8 & *(char *)(lVar30 + 0x28) == '\0')) {
      *(undefined1 *)((long)hal + lVar29 + 0x3768) = 0;
    }
  }
  pcVar31 = (char *)((long)hal + 0x376a);
  uVar26 = 0;
  uVar34 = 0xffffffff;
  while( true ) {
    iVar39 = (int)uVar34;
    iVar10 = (int)uVar21;
    if (uVar26 == 3) break;
    if (((long)uVar26 < lVar17) && (*pcVar31 != '\0')) {
      if (iVar10 == -1) {
        uVar21 = uVar26 & 0xffffffff;
      }
      else {
        pcVar38 = pcVar31;
        if (iVar39 != -1) goto LAB_0025a70c;
        uVar34 = uVar26 & 0xffffffff;
      }
    }
    else {
      pcVar38 = (char *)((long)puVar18 + uVar26 * 0x38 + 0x2a);
LAB_0025a70c:
      *pcVar38 = '\0';
    }
    uVar26 = uVar26 + 1;
    pcVar31 = pcVar31 + 0x38;
  }
  iVar40 = 0;
  if (iVar10 != -1) {
    iVar40 = iVar10;
  }
  *(int *)((long)hal + 0x488) = iVar40;
  *(int *)((long)hal + 0x484) = iVar40;
  lVar29 = *(long *)((long)hal + 0x37e8);
  if (*(char *)(lVar29 + 0x25) != '\0') {
    *(undefined1 *)((long)hal + (long)iVar40 * 0x38 + 0x376a) = 1;
    uVar1 = *(undefined8 *)((long)hal + (long)iVar40 * 0x38 + 0x3750);
    uVar42 = (undefined4)uVar1;
    uVar44 = (undefined4)((ulong)uVar1 >> 0x20);
    *(undefined4 *)((long)hal + 0x1c4) = uVar42;
    *(undefined4 *)((long)hal + 0x1c8) = uVar42;
    *(undefined4 *)((long)hal + 0x1cc) = uVar44;
    *(undefined4 *)((long)hal + 0x1d0) = uVar44;
    *(int *)((long)hal + 0x488) = iVar40;
    *(int *)((long)hal + 0x484) = iVar40;
    *(undefined4 *)((long)hal + 0x48c) = 0;
    if (iVar39 != -1) {
      *(undefined4 *)((long)hal + 0x1c8) = *(undefined4 *)((long)hal + (long)iVar39 * 0x38 + 0x3750)
      ;
      *(undefined4 *)((long)hal + 0x1d0) = *(undefined4 *)((long)hal + (long)iVar39 * 0x38 + 0x3754)
      ;
      *(int *)((long)hal + 0x488) = iVar39;
      *(undefined4 *)((long)hal + 0x48c) = 1;
    }
  }
  *(undefined4 *)((long)hal + 0x1b4) = 0;
  iVar10 = *(int *)(lVar29 + 0x10);
  if (iVar10 == 0) {
    lVar30 = -1;
    if (-1 < lVar17) {
      lVar30 = lVar17;
    }
    uVar21 = 0xffffffffffffffff;
    for (uVar34 = 0; lVar30 + 1U != uVar34; uVar34 = uVar34 + 1) {
      if ((((lVar20 != lVar29) && ((*(byte *)(lVar20 + 0x27) & ~*(byte *)(lVar29 + 0x27)) == 0)) &&
          ((*(byte *)(lVar20 + 0x29) & ~*(byte *)(lVar29 + 0x29)) == 0)) &&
         (uVar21 = uVar21 & 0xffffffff, (*(byte *)(lVar20 + 0x28) & ~*(byte *)(lVar29 + 0x28)) == 0)
         ) {
        uVar21 = uVar34 & 0xffffffff;
      }
      lVar20 = lVar20 + 0x38;
    }
    if ((int)uVar21 < 0) {
      *(undefined4 *)((long)hal + 0x1b4) = 1;
      iVar10 = 0;
    }
    else {
      lVar17 = (uVar21 & 0xffffffff) * 0x38;
      *(undefined4 *)(lVar29 + 0x10) = *(undefined4 *)((long)hal + lVar17 + 0x3670);
      *(undefined4 *)((long)hal + lVar17 + 0x3670) = 0;
      iVar10 = *(int *)(lVar29 + 0x10);
    }
  }
  *(int *)((long)hal + 0x1bc) = iVar10;
  *(undefined4 *)((long)hal + 0x1c0) = *(undefined4 *)(lVar29 + 0x14);
  vp8e_init_entropy(hal);
  lVar17 = *(long *)((long)hal + 0x60);
  pcVar31 = *(char **)((long)hal + 0x128);
  iVar10 = *(int *)(*(long *)((long)hal + 0x158) + 0x18);
  if (*(int *)((long)hal + 0x36c) != 0) {
    iVar39 = iVar10 - *(int *)((long)hal + 0x36c);
    if (0x7e < iVar39) {
      iVar39 = 0x7f;
    }
    iVar40 = 0;
    if (0 < iVar39) {
      iVar40 = iVar39;
    }
    *(int *)(pcVar31 + 0x20) = iVar40;
  }
  if (*(int *)((long)hal + 0x370) != 0) {
    iVar10 = iVar10 - *(int *)((long)hal + 0x370);
    iVar39 = 0x7f;
    if (iVar10 < 0x7f) {
      iVar39 = iVar10;
    }
    iVar10 = 0;
    if (0 < iVar39) {
      iVar10 = iVar39;
    }
    *(int *)(pcVar31 + 0x24) = iVar10;
  }
  buf = (RK_U32 *)mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar17 + 0x40),"set_segmentation");
  uVar23 = *(int *)((long)hal + 0x6928) + 0xfU >> 1 & 0xfffffff8;
  mpp_buffer_sync_begin_f(*(MppBuffer *)(lVar17 + 0x40),0,"set_segmentation");
  if ((*(int *)((long)hal + 0x36c) == 0) && (*(int *)((long)hal + 0x370) == 0)) {
    if ((pcVar31[0x18] != '\0') && (*pcVar31 != '\0')) {
      *(undefined1 (*) [16])(pcVar31 + 4) = (undefined1  [16])0x0;
      uVar32 = 0;
      for (uVar21 = 0; uVar21 != uVar23 >> 2; uVar21 = uVar21 + 1) {
        uVar25 = buf[uVar21];
        uVar33 = uVar32;
        for (iVar10 = 0x1c; iVar10 != -4; iVar10 = iVar10 + -4) {
          if (uVar33 < *(uint *)((long)hal + 0x6928)) {
            *(int *)(pcVar31 + (ulong)(uVar25 >> ((byte)iVar10 & 0x1f) & 0xf) * 4 + 4) =
                 *(int *)(pcVar31 + (ulong)(uVar25 >> ((byte)iVar10 & 0x1f) & 0xf) * 4 + 4) + 1;
          }
          uVar33 = uVar33 + 1;
        }
        uVar32 = uVar32 + 8;
      }
      goto LAB_0025a9b5;
    }
  }
  else {
    pcVar31[0x18] = '\x01';
    *(undefined1 (*) [16])(pcVar31 + 4) = (undefined1  [16])0x0;
    uVar33 = 0;
    pRVar22 = buf;
    uVar32 = 0;
    for (uVar25 = 0; uVar25 < *(uint *)((long)hal + 0x6930); uVar25 = uVar25 + 1) {
      for (uVar28 = 0; uVar28 < *(uint *)((long)hal + 0x692c); uVar28 = uVar28 + 1) {
        uVar21 = 0;
        if (*(uint *)((long)hal + 0x350) <= uVar28) {
          uVar21 = 0;
          if ((uVar28 <= *(uint *)((long)hal + 0x358)) && (*(uint *)((long)hal + 0x34c) <= uVar25))
          {
            uVar21 = (ulong)(uVar25 <= *(uint *)((long)hal + 0x354));
          }
          if (((uVar28 <= *(uint *)((long)hal + 0x368)) && (*(uint *)((long)hal + 0x35c) <= uVar25))
             && (uVar25 <= *(uint *)((long)hal + 0x364))) {
            uVar21 = 2;
          }
        }
        *(int *)(pcVar31 + uVar21 * 4 + 4) = *(int *)(pcVar31 + uVar21 * 4 + 4) + 1;
        uVar35 = uVar28 + uVar32 & 7;
        uVar33 = (int)uVar21 << ((char)uVar35 * '\x04' ^ 0x1cU) | uVar33;
        if (uVar35 == 7) {
          *pRVar22 = uVar33;
          pRVar22 = pRVar22 + 1;
          uVar33 = 0;
        }
      }
      uVar32 = uVar28 + uVar32;
    }
    *pRVar22 = uVar33;
LAB_0025a9b5:
    vp8e_swap_endian(buf,uVar23);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar17 + 0x40),0,"set_segmentation");
  lVar17 = *(long *)((long)hal + 0x37e8);
  if ((*(char *)(lVar17 + 0x24) == '\0') && (pcVar31[0x18] != '\0')) {
    *(undefined8 *)((long)hal + 0x130) = *(undefined8 *)((long)hal + 0x128);
  }
  else {
    *(undefined4 *)((long)hal + 0x148) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x14c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x150) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x154) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x138) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x13c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x140) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x144) = 0xffffffff;
    *(undefined8 *)((long)hal + 0x130) = 0;
  }
  if (*(int *)((long)hal + 0xc4) != 0) {
    lVar20 = *(long *)((long)hal + 0x128);
    if (*(int *)((long)hal + 0x6924) == 0) {
      *(undefined4 *)((long)hal + 0xa8) = 0x1a;
      iVar39 = (int)*(undefined8 *)(lVar20 + 0x1c);
      iVar10 = (int)((ulong)*(undefined8 *)(lVar20 + 0x1c) >> 0x20);
      *(ulong *)(lVar20 + 0x2c) =
           CONCAT44(-(uint)(-0x12 < iVar10),-(uint)(-0x12 < iVar39)) &
           (CONCAT44(-(uint)(0x6f < iVar10) >> 0x1a,-(uint)(0x6f < iVar39) >> 0x1a) |
           ~CONCAT44(-(uint)(0x6f < iVar10),-(uint)(0x6f < iVar39)) &
           CONCAT44(iVar10 / 2 + 8,iVar39 / 2 + 8));
      iVar10 = *(int *)(lVar20 + 0x24);
      iVar39 = *(int *)(lVar20 + 0x28);
      RVar12 = iVar10 / 2 + 8;
      if (0x6f < iVar10) {
        RVar12 = 0x3f;
      }
      if (iVar10 < -0x11) {
        RVar12 = 0;
      }
      *(RK_S32 *)(lVar20 + 0x34) = RVar12;
      RVar12 = iVar39 / 2 + 8;
      if (0x6f < iVar39) {
        RVar12 = 0x3f;
      }
      if (iVar39 < -0x11) {
        RVar12 = 0;
      }
    }
    else {
      *(RK_S32 *)((long)hal + 0xa8) = 0xc;
      *(RK_S32 *)(lVar20 + 0x2c) = inter_level_tbl[*(int *)(lVar20 + 0x1c)];
      *(RK_S32 *)(lVar20 + 0x30) = inter_level_tbl[*(int *)(lVar20 + 0x20)];
      *(RK_S32 *)(lVar20 + 0x34) = inter_level_tbl[*(int *)(lVar20 + 0x24)];
      RVar12 = inter_level_tbl[*(int *)(lVar20 + 0x28)];
    }
    *(RK_S32 *)(lVar20 + 0x38) = RVar12;
  }
  if (*(int *)((long)hal + 200) != 0) {
    *(undefined4 *)((long)hal + 0xac) = 0;
  }
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)((long)hal + 0xcc) == '\x02') {
      *(undefined1 *)((long)hal + 0xcc) = 1;
    }
    else if (*(int *)((long)hal + 0xa8) == 0) {
      *(undefined1 (*) [16])((long)hal + 0xd0) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xf0) = (undefined1  [16])0x0;
    }
    else if (((*(char *)(lVar17 + 0x27) == '\0') && (*(char *)(lVar17 + 0x29) == '\0')) &&
            (*(char *)(lVar17 + 0x28) == '\0')) {
      *(undefined8 *)((long)hal + 0xf0) = *(undefined8 *)((long)hal + 0x100);
      *(undefined8 *)((long)hal + 0xf8) = *(undefined8 *)((long)hal + 0x108);
      *(undefined8 *)((long)hal + 0xd0) = *(undefined8 *)((long)hal + 0xe0);
      *(undefined8 *)((long)hal + 0xd8) = *(undefined8 *)((long)hal + 0xe8);
    }
    else {
      *(undefined8 *)((long)hal + 0xf0) = 2;
      *(undefined8 *)((long)hal + 0xf8) = 0xfffffffefffffffe;
      *(undefined8 *)((long)hal + 0xd0) = 0xfffffffe00000004;
      *(undefined8 *)((long)hal + 0xd8) = 0x400000002;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        iVar10 = *(int *)((long)hal + lVar20 * 4 + 0xd0);
        iVar39 = *(int *)((long)hal + lVar20 * 4 + 0xf0);
        if (0x3e < iVar39) {
          iVar39 = 0x3f;
        }
        if (iVar39 < -0x3e) {
          iVar39 = -0x3f;
        }
        *(int *)((long)hal + lVar20 * 4 + 0xf0) = iVar39;
        if (0x3e < iVar10) {
          iVar10 = 0x3f;
        }
        if (iVar10 < -0x3e) {
          iVar10 = -0x3f;
        }
        *(int *)((long)hal + lVar20 * 4 + 0xd0) = iVar10;
      }
    }
  }
  lVar20 = *(long *)((long)hal + 0x128);
  if (*(char *)(lVar17 + 0x24) != '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x90),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x94),1);
  }
  uVar23 = 1;
  MVar11 = vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar20 + 0x18),1);
  if (*(char *)(lVar20 + 0x18) != '\0') {
    pbVar3 = *(byte **)((long)hal + 0x128);
    auVar43._0_4_ =
         -(uint)(*(int *)((long)hal + 0x148) == *(int *)(pbVar3 + 0x2c) &&
                *(int *)(pbVar3 + 0x1c) == *(int *)((long)hal + 0x138));
    auVar43._4_4_ =
         -(uint)(*(int *)((long)hal + 0x14c) == *(int *)(pbVar3 + 0x30) &&
                *(int *)(pbVar3 + 0x20) == *(int *)((long)hal + 0x13c));
    auVar43._8_4_ =
         -(uint)(*(int *)((long)hal + 0x150) == *(int *)(pbVar3 + 0x34) &&
                *(int *)(pbVar3 + 0x24) == *(int *)((long)hal + 0x140));
    auVar43._12_4_ =
         -(uint)(*(int *)((long)hal + 0x154) == *(int *)(pbVar3 + 0x38) &&
                *(int *)(pbVar3 + 0x28) == *(int *)((long)hal + 0x144));
    iVar10 = movmskps(MVar11,auVar43);
    if (*(long *)((long)hal + 0x130) == 0) {
      *pbVar3 = 1;
    }
    else {
      uVar23 = (uint)*pbVar3;
    }
    vp8e_put_lit(bitbuf,uVar23,1);
    vp8e_put_lit(bitbuf,(uint)(iVar10 != 0xf),1);
    if (iVar10 != 0xf) {
      vp8e_put_lit(bitbuf,1,1);
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar23 = *(uint *)(pbVar3 + 0x1c + lVar20 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar32 = -uVar23;
        if (0 < (int)uVar23) {
          uVar32 = uVar23;
        }
        vp8e_put_lit(bitbuf,uVar32,7);
        vp8e_put_lit(bitbuf,uVar23 >> 0x1f,1);
      }
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar23 = *(uint *)(pbVar3 + 0x2c + lVar20 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar32 = -uVar23;
        if (0 < (int)uVar23) {
          uVar32 = uVar23;
        }
        vp8e_put_lit(bitbuf,uVar32,6);
        vp8e_put_lit(bitbuf,uVar23 >> 0x1f,1);
      }
    }
    if (*pbVar3 != 0) {
      iVar27 = *(int *)(pbVar3 + 8) + *(int *)(pbVar3 + 4);
      iVar40 = *(int *)(pbVar3 + 0x10) + *(int *)(pbVar3 + 0xc);
      iVar10 = (iVar27 * 0xff) / (iVar40 + iVar27);
      iVar39 = 0xff;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      *(int *)((long)hal + 0x3630) = iVar10;
      iVar10 = 0xff;
      if (iVar27 != 0) {
        iVar10 = (*(int *)(pbVar3 + 4) * 0xff) / iVar27;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      *(int *)((long)hal + 0x3634) = iVar10;
      if (iVar40 != 0) {
        iVar39 = (*(int *)(pbVar3 + 0xc) * 0xff) / iVar40;
      }
      iVar10 = 0xff;
      if (iVar39 < 0xff) {
        iVar10 = iVar39;
      }
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      *(int *)((long)hal + 0x3638) = iVar10;
      for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
        if (*(int *)(pbVar3 + lVar20 * 4 + 4) == 0) {
          RVar12 = 0;
          RVar13 = 1;
        }
        else {
          vp8e_put_lit(bitbuf,1,1);
          RVar12 = *(RK_S32 *)((long)hal + lVar20 * 4 + 0x3630);
          RVar13 = 8;
        }
        vp8e_put_lit(bitbuf,RVar12,RVar13);
      }
    }
    uVar1 = *(undefined8 *)(pbVar3 + 0x24);
    *(undefined8 *)((long)hal + 0x138) = *(undefined8 *)(pbVar3 + 0x1c);
    *(undefined8 *)((long)hal + 0x140) = uVar1;
    uVar1 = *(undefined8 *)(pbVar3 + 0x34);
    *(undefined8 *)((long)hal + 0x148) = *(undefined8 *)(pbVar3 + 0x2c);
    *(undefined8 *)((long)hal + 0x150) = uVar1;
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa4),1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa8),6);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xac),3);
  vp8e_put_lit(bitbuf,(uint)*(byte *)((long)hal + 0xcc),1);
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)(lVar17 + 0x24) != '\0') {
      *(undefined1 (*) [16])((long)hal + 0x100) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xe0) = (undefined1  [16])0x0;
    }
    bVar8 = 0;
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      iVar10 = *(int *)((long)hal + lVar20 * 4 + 0xd0);
      iVar39 = *(int *)((long)hal + lVar20 * 4 + 0xe0);
      mode_update[lVar20] = (uint)(iVar10 != iVar39);
      bVar41 = *(int *)((long)hal + lVar20 * 4 + 0xf0) != *(int *)((long)hal + 0x100 + lVar20 * 4);
      if (bVar41) {
        bVar8 = 1;
      }
      auStack_88[lVar20] = (uint)bVar41;
      if (iVar10 != iVar39) {
        bVar8 = 1;
      }
    }
    if (*(int *)((long)hal + 0x110) == 0) {
      bVar8 = 1;
    }
    vp8e_put_lit(bitbuf,(uint)bVar8,1);
    if (bVar8 != 0) {
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar23 = auStack_88[lVar20];
        vp8e_put_lit(bitbuf,uVar23,1);
        if (uVar23 != 0) {
          uVar23 = *(uint *)((long)hal + 0xf0 + lVar20 * 4);
          uVar32 = -uVar23;
          if (0 < (int)uVar23) {
            uVar32 = uVar23;
          }
          vp8e_put_lit(bitbuf,uVar32,6);
          vp8e_put_lit(bitbuf,uVar23 >> 0x1f,1);
        }
      }
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        RVar12 = mode_update[lVar20];
        vp8e_put_lit(bitbuf,RVar12,1);
        if (RVar12 != 0) {
          uVar23 = *(uint *)((long)hal + 0xd0 + lVar20 * 4);
          uVar32 = -uVar23;
          if (0 < (int)uVar23) {
            uVar32 = uVar23;
          }
          vp8e_put_lit(bitbuf,uVar32,6);
          vp8e_put_lit(bitbuf,uVar23 >> 0x1f,1);
        }
      }
      *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0xf0);
      *(undefined8 *)((long)hal + 0x108) = *(undefined8 *)((long)hal + 0xf8);
      *(undefined8 *)((long)hal + 0xe0) = *(undefined8 *)((long)hal + 0xd0);
      *(undefined8 *)((long)hal + 0xe8) = *(undefined8 *)((long)hal + 0xd8);
    }
  }
  uVar23 = 6;
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x98),2);
  vp8e_put_lit(bitbuf,*(RK_S32 *)(*(long *)((long)hal + 0x158) + 0x18),7);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  if (*(char *)(lVar17 + 0x24) == '\0') {
    iVar10 = 1;
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar17 + 0x29),1);
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar17 + 0x28),1);
    if (*(char *)(lVar17 + 0x29) == '\0') {
      if (*(char *)((long)hal + 0x3769) == '\0') {
        RVar12 = (uint)(*(char *)((long)hal + 0x37d9) != '\0') * 2;
      }
      else {
        RVar12 = 1;
      }
      vp8e_put_lit(bitbuf,RVar12,2);
    }
    if (*(char *)(lVar17 + 0x28) == '\0') {
      if (*(char *)((long)hal + 0x3768) == '\0') {
        iVar10 = (uint)(*(char *)((long)hal + 0x37a0) != '\0') * 2;
      }
      vp8e_put_lit(bitbuf,iVar10,2);
    }
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xbc),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xc0),1);
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x110),1);
  if (*(char *)(lVar17 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar17 + 0x27),1);
  }
  vp8e_calc_coeff_prob
            (bitbuf,(RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x13a0),
             (RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x2420));
  vp8e_put_lit(bitbuf,1,1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x524),8);
  if (*(char *)(lVar17 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x528),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x52c),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x530),8);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_calc_mv_prob(bitbuf,(RK_S32 (*) [2] [19])((long)hal + 0x34b0),
                      (RK_S32 (*) [2] [19])((long)hal + 0x3548));
  }
  lVar17 = *(long *)((long)hal + 0x60);
  *(uint *)((long)hal + 0x19c) = *(uint *)((long)hal + 0x19c) >> 3 & 0xfffffff8;
  uVar25 = *(int *)((long)hal + 0x198) + *(int *)((long)hal + 0x3834);
  *(uint *)((long)hal + 0x198) = uVar25;
  uVar25 = uVar25 & 7;
  uVar32 = uVar25 << 3;
  *(uint *)((long)hal + 0x1a0) = uVar32;
  if (uVar25 == 0) {
    *(undefined4 *)((long)hal + 0x1a8) = 0;
    uVar23 = 0;
    lVar20 = 0x1a4;
  }
  else {
    puVar19 = (uint *)((ulong)bitbuf->data & 0xfffffffffffffff8);
    while (uVar32 >> 3 <= uVar23) {
      *(undefined1 *)((long)puVar19 + (ulong)uVar23) = 0;
      uVar23 = uVar23 - 1;
      uVar32 = *(uint *)((long)hal + 0x1a0);
    }
    uVar23 = *puVar19;
    *(uint *)((long)hal + 0x1a4) =
         uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
    uVar23 = 0;
    lVar20 = 0x1a8;
    if (0x20 < uVar32) {
      uVar23 = (uint)*(byte *)((long)puVar19 + 6) << 8 |
               (uint)*(byte *)((long)puVar19 + 5) << 0x10 | puVar19[1] << 0x18;
    }
  }
  *(uint *)((long)hal + lVar20) = uVar23;
  if (*(int *)((long)hal + 0xb0) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x1fe1) goto LAB_0025b3ba;
LAB_0025b3a2:
    *(undefined4 *)((long)hal + 0x300) = 1;
  }
  else {
    if (*(int *)((long)hal + 0xb0) == 0) goto LAB_0025b3a2;
LAB_0025b3ba:
    *(undefined4 *)((long)hal + 0x300) = 0;
  }
  *(undefined4 *)((long)hal + 0x188) = 1;
  if (*(int *)((long)hal + 0xb4) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x631) goto LAB_0025b3ef;
  }
  else if (*(int *)((long)hal + 0xb4) != 0) {
LAB_0025b3ef:
    *(undefined4 *)((long)hal + 0x4f0) = 1;
    goto LAB_0025b3f9;
  }
  *(undefined4 *)((long)hal + 0x4f0) = 0;
LAB_0025b3f9:
  uVar23 = *(uint *)(*(long *)((long)hal + 0x158) + 0x18);
  uVar21 = (ulong)uVar23;
  if (*(int *)((long)hal + 0x318) == -1) {
    if (*(int *)((long)hal + 0x528) < 0x81) {
      iVar10 = 0x28;
      if (0x28 < (int)(uVar23 * 2)) {
        iVar10 = uVar23 * 2;
      }
      uVar32 = iVar10 - 0x28;
    }
    else {
      uVar32 = 0x80U - *(int *)((long)hal + 0x528) & 0xffff;
    }
    *(uint *)((long)hal + 0x318) = uVar32;
  }
  if (*(int *)((long)hal + 0x324) == -1) {
    *(undefined4 *)((long)hal + 0x324) = 0x20;
  }
  if (*(int *)((long)hal + 0x328) == -1) {
    *(undefined4 *)((long)hal + 0x328) = 0x3c0;
  }
  if (*(int *)((long)hal + 0x32c) == -1) {
    *(undefined4 *)((long)hal + 0x32c) = 8;
  }
  if (*(int *)((long)hal + 0x31c) == -1) {
    uVar32 = 0;
    if (99 < (int)uVar23) {
      uVar32 = uVar23 * 3 >> 2;
    }
    *(uint *)((long)hal + 0x31c) = uVar32;
  }
  if (*(int *)((long)hal + 800) == -1) {
    iVar10 = (uVar23 - 10) + (uVar23 >> 2);
    if ((int)uVar23 < 8) {
      iVar10 = 0;
    }
    *(int *)((long)hal + 800) = iVar10;
  }
  if (*(int *)((long)hal + 0x4f4) == 0) {
    iVar10 = 0x3ff;
    if (vp8_split_penalty_tbl[(int)uVar23] < 0x7fe) {
      iVar10 = vp8_split_penalty_tbl[(int)uVar23] / 2;
    }
    *(int *)((long)hal + 0x4f4) = iVar10;
  }
  if (*(int *)((long)hal + 0x4f8) == 0) {
    iVar10 = 0x3ff;
    if (vp8_split_penalty_tbl[(int)uVar23] < 0x7ea) {
      iVar10 = (vp8_split_penalty_tbl[(int)uVar23] * 2 + 0x28) / 4;
    }
    *(int *)((long)hal + 0x4f8) = iVar10;
  }
  if (*(int *)((long)hal + 0x500) == 0) {
    iVar10 = 0x1ff;
    if (vp8_split_penalty_tbl[(int)uVar23] < 0x3c0) {
      iVar10 = (vp8_split_penalty_tbl[(int)uVar23] * 8 + 500) / 0x10;
    }
    *(int *)((long)hal + 0x500) = iVar10;
  }
  puVar24 = (undefined1 *)((long)hal + 0x278);
  for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 2) {
    puVar24[-0x80] = (char)lVar20;
    RVar12 = vp8e_calc_cost_mv((RK_S32)lVar20,(RK_S32 *)((long)hal + 0x34b0));
    RVar13 = vp8e_calc_cost_mv((RK_S32)lVar20,(RK_S32 *)((long)hal + 0x34fc));
    iVar10 = ((RVar13 + RVar12 + 1) / 2) * weight_tbl[(int)uVar23];
    uVar9 = (undefined1)((uint)iVar10 >> 8);
    if (0xfe < iVar10 >> 8) {
      uVar9 = 0xff;
    }
    *puVar24 = uVar9;
    puVar24 = puVar24 + 1;
  }
  lVar20 = *(long *)((long)hal + 0x128);
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    uVar21 = (ulong)*(int *)(lVar20 + 0x1c + lVar29 * 4);
    lVar30 = uVar21 * 0x20;
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3d4) = *(undefined2 *)((long)hal + lVar30 + 0x3898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3dc) = *(undefined2 *)((long)hal + lVar30 + 0x389c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3e4) = *(undefined2 *)((long)hal + lVar30 + 0x4898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3ec) = *(undefined2 *)((long)hal + lVar30 + 0x489c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3f4) = *(undefined2 *)((long)hal + lVar30 + 0x5898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3fc) = *(undefined2 *)((long)hal + lVar30 + 0x589c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x404) = *(undefined2 *)((long)hal + lVar30 + 0x38a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x40c) = *(undefined2 *)((long)hal + lVar30 + 0x38a4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x414) = *(undefined2 *)((long)hal + lVar30 + 0x48a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x41c) = *(undefined2 *)((long)hal + lVar30 + 0x48a4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x424) = *(undefined2 *)((long)hal + lVar30 + 0x58a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x42c) = *(undefined2 *)((long)hal + lVar30 + 0x58a4);
    *(undefined1 *)((long)hal + lVar29 + 0x434) = *(undefined1 *)((long)hal + lVar30 + 0x38a8);
    *(undefined1 *)((long)hal + lVar29 + 0x438) = *(undefined1 *)((long)hal + lVar30 + 0x38ac);
    *(undefined1 *)((long)hal + lVar29 + 0x43c) = *(undefined1 *)((long)hal + lVar30 + 0x48a8);
    *(undefined1 *)((long)hal + lVar29 + 0x440) = *(undefined1 *)((long)hal + lVar30 + 0x48ac);
    *(undefined1 *)((long)hal + lVar29 + 0x444) = *(undefined1 *)((long)hal + lVar30 + 0x58a8);
    *(undefined1 *)((long)hal + lVar29 + 0x448) = *(undefined1 *)((long)hal + lVar30 + 0x58ac);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x44c) = *(undefined2 *)((long)hal + lVar30 + 0x38b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x454) = *(undefined2 *)((long)hal + lVar30 + 0x38b4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x45c) = *(undefined2 *)((long)hal + lVar30 + 0x48b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x464) = *(undefined2 *)((long)hal + lVar30 + 0x48b4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x46c) = *(undefined2 *)((long)hal + lVar30 + 0x58b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x474) = *(undefined2 *)((long)hal + lVar30 + 0x58b4);
    *(undefined4 *)((long)hal + lVar29 * 4 + 0x4a0) = *(undefined4 *)(lVar20 + 0x2c + lVar29 * 4);
  }
  *(undefined4 *)((long)hal + 0x490) = *(undefined4 *)((long)hal + 0x383c);
  *(int *)((long)hal + 0x494) = 0x18 - *(int *)((long)hal + 0x3840);
  *(undefined4 *)((long)hal + 0x498) = *(undefined4 *)((long)hal + 0x3838);
  *(uint *)((long)hal + 0x170) = (uint)(*(char *)(*(long *)((long)hal + 0x37e8) + 0x24) != '\0');
  iVar10 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar17 + 0x38),"set_new_frame");
  *(int *)((long)hal + 0x1ac) = iVar10;
  *(undefined4 *)((long)hal + 0x49c) = *(undefined4 *)((long)hal + 0x98);
  *(undefined4 *)((long)hal + 0x184) = *(undefined4 *)((long)hal + 0xa4);
  *(undefined4 *)((long)hal + 0x4b0) = *(undefined4 *)((long)hal + 0xac);
  pbVar3 = *(byte **)((long)hal + 0x128);
  *(uint *)((long)hal + 0x47c) = (uint)pbVar3[0x18];
  *(uint *)((long)hal + 0x480) = (uint)*pbVar3;
  *pbVar3 = 0;
  for (lVar20 = 0x145; lVar20 != 0x149; lVar20 = lVar20 + 1) {
    *(undefined4 *)((long)hal + lVar20 * 4 + -0x10) =
         *(undefined4 *)((long)hal + lVar20 * 4 + -0x424);
    *(undefined4 *)((long)hal + lVar20 * 4) = *(undefined4 *)((long)hal + lVar20 * 4 + -0x444);
  }
  uVar23 = (uint)uVar21;
  for (lVar20 = 0; lVar20 != 10; lVar20 = lVar20 + 1) {
    *(int *)((long)hal + lVar20 * 4 + 0x4c4) =
         (int)(intra4_mode_tree_penalty_tbl[lVar20] * (uVar23 * 2 + 8)) >> 8;
  }
  for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
    *(int *)((long)hal + lVar20 * 4 + 0x4b4) =
         (int)(intra16_mode_tree_penalty_tbl[lVar20] * (uVar23 * 2 + 0x40)) >> 8;
  }
  if (*(int *)((long)hal + 0x310) == -1) {
    *(uint *)((long)hal + 0x310) = (uVar23 & 0x3fffff) << 3;
  }
  pvVar16 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar17 + 0x48),"set_new_frame");
  memset(pvVar16,0,0x1e8);
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar17 + 0x48),0,"set_new_frame");
  vp8e_write_entropy_tables(hal);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_enc_strm_code(void *hal, HalEncTask *task)
{
    HalVp8eCtx  *ctx  = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;
    VepuOffsetCfg hw_offset;

    MppEncCfgSet  *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;

    {
        RK_U32 i = 0;
        for (i = 0; i < 9; i++) {
            ctx->p_out_buf[i] = NULL;
            ctx->stream_size[i] = 0;
        }
    }

    {
        hw_offset.fmt = prep->format;

        hw_offset.width = prep->width;
        hw_offset.height = prep->height;
        hw_offset.hor_stride = prep->hor_stride;
        hw_offset.ver_stride = prep->ver_stride;
        hw_offset.offset_x = mpp_frame_get_offset_x(task->frame);
        hw_offset.offset_y = mpp_frame_get_offset_y(task->frame);

        get_vepu_offset_cfg(&hw_offset);
    }

    {
        HalEncTask *enc_task = task;

        hw_cfg->input_lum_base = mpp_buffer_get_fd(enc_task->input);
        hw_cfg->input_cb_base  = hw_cfg->input_lum_base;
        hw_cfg->input_cr_base  = hw_cfg->input_cb_base;
        hw_cfg->input_lum_offset = hw_offset.offset_byte[0];
        hw_cfg->input_cb_offset = hw_offset.offset_byte[1];
        hw_cfg->input_cr_offset  = hw_offset.offset_byte[2];
    }

    // split memory for vp8 partition
    {
        RK_S32 offset = 0;
        Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
        RK_U8 *p_end = NULL;
        RK_U32 buf_size = mpp_buffer_get_size(buffers->hw_out_buf);
        RK_U32 bus_addr = mpp_buffer_get_fd(buffers->hw_out_buf);
        RK_U8 *p_start = mpp_buffer_get_ptr(buffers->hw_out_buf);

        p_end = p_start + 3;
        if (ctx->frame_type == VP8E_FRM_KEY)
            p_end += 7;// frame tag len:I frame 10 byte, P frmae 3 byte.
        vp8e_set_buffer(&ctx->bitbuf[0], p_start, p_end - p_start);

        offset = p_end - p_start;
        hw_cfg->output_strm_base = bus_addr;
        hw_cfg->output_strm_offset = offset;

        p_start = p_end;
        p_end = p_start + buf_size / 10;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[1], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[0] = bus_addr;
        hw_cfg->partition_offset[0] = offset;

        p_start = p_end;
        p_end = mpp_buffer_get_ptr(buffers->hw_out_buf) + buf_size;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[2], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[1] = bus_addr;
        hw_cfg->partition_offset[1] = offset;
        hw_cfg->output_strm_size = p_end - p_start;

        p_start = p_end;
    }

    {
        HalVp8ePicBuf *pic_buf = &ctx->picbuf;

        pic_buf->cur_pic->show = 1;
        pic_buf->cur_pic->poc = ctx->frame_cnt;
        pic_buf->cur_pic->i_frame = (ctx->frame_type == VP8E_FRM_KEY);

        init_picbuf(ctx);

        if (ctx->frame_type == VP8E_FRM_P) {
            pic_buf->cur_pic->p_frame = 1;
            pic_buf->cur_pic->arf = 1;
            pic_buf->cur_pic->grf = 1;
            pic_buf->cur_pic->ipf = 1;
            pic_buf->ref_pic_list[0].search = 1;
            pic_buf->ref_pic_list[1].search = 1;
            pic_buf->ref_pic_list[2].search = 1;
        }

        if (ctx->rc->frame_coded == 0)
            return MPP_OK;

        if (ctx->rc->golden_picture_rate) {
            pic_buf->cur_pic->grf = 1;
            if (!pic_buf->cur_pic->arf)
                pic_buf->ref_pic_list[1].arf = 1;
        }
    }
    set_frame_params(ctx);
    set_picbuf_ref(ctx);
    set_code_frame(ctx);

    return MPP_OK;
}